

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O0

VP8StatusCode ParsePartitions(VP8Decoder *dec,uint8_t *buf,size_t size)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong in_RDX;
  uint3 *in_RSI;
  long in_RDI;
  size_t psize;
  size_t p;
  size_t last_part;
  size_t size_left;
  uint8_t *part_start;
  uint8_t *buf_end;
  uint8_t *sz;
  VP8BitReader *br;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  VP8BitReader *in_stack_ffffffffffffffa0;
  ulong local_58;
  VP8BitReader *local_48;
  ulong local_40;
  uint3 *local_30;
  VP8StatusCode local_4;
  
  uVar1 = VP8GetValue(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  *(int *)(in_RDI + 0x1b0) = (1 << ((byte)uVar1 & 0x1f)) + -1;
  uVar2 = (ulong)*(uint *)(in_RDI + 0x1b0);
  if (in_RDX < uVar2 * 3) {
    local_4 = VP8_STATUS_NOT_ENOUGH_DATA;
  }
  else {
    local_40 = (long)in_RSI + uVar2 * 3;
    local_48 = (VP8BitReader *)(in_RDX + uVar2 * -3);
    local_30 = in_RSI;
    for (local_58 = 0; local_58 < uVar2; local_58 = local_58 + 1) {
      in_stack_ffffffffffffffa0 = (VP8BitReader *)(long)(int)(uint)*local_30;
      if (local_48 < in_stack_ffffffffffffffa0) {
        in_stack_ffffffffffffffa0 = local_48;
      }
      VP8InitBitReader(in_stack_ffffffffffffffa0,
                       (uint8_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       0x10bffd);
      local_40 = (long)&in_stack_ffffffffffffffa0->value_ + local_40;
      local_48 = (VP8BitReader *)((long)local_48 - (long)in_stack_ffffffffffffffa0);
      local_30 = (uint3 *)((long)local_30 + 3);
    }
    VP8InitBitReader(in_stack_ffffffffffffffa0,
                     (uint8_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     0x10c063);
    if (local_40 < (long)in_RSI + in_RDX) {
      local_4 = VP8_STATUS_OK;
    }
    else {
      local_4 = VP8_STATUS_NOT_ENOUGH_DATA;
      if (*(int *)(in_RDI + 0x40) != 0) {
        local_4 = VP8_STATUS_SUSPENDED;
      }
    }
  }
  return local_4;
}

Assistant:

static VP8StatusCode ParsePartitions(VP8Decoder* const dec,
                                     const uint8_t* buf, size_t size) {
  VP8BitReader* const br = &dec->br_;
  const uint8_t* sz = buf;
  const uint8_t* buf_end = buf + size;
  const uint8_t* part_start;
  size_t size_left = size;
  size_t last_part;
  size_t p;

  dec->num_parts_minus_one_ = (1 << VP8GetValue(br, 2, "global-header")) - 1;
  last_part = dec->num_parts_minus_one_;
  if (size < 3 * last_part) {
    // we can't even read the sizes with sz[]! That's a failure.
    return VP8_STATUS_NOT_ENOUGH_DATA;
  }
  part_start = buf + last_part * 3;
  size_left -= last_part * 3;
  for (p = 0; p < last_part; ++p) {
    size_t psize = sz[0] | (sz[1] << 8) | (sz[2] << 16);
    if (psize > size_left) psize = size_left;
    VP8InitBitReader(dec->parts_ + p, part_start, psize);
    part_start += psize;
    size_left -= psize;
    sz += 3;
  }
  VP8InitBitReader(dec->parts_ + last_part, part_start, size_left);
  if (part_start < buf_end) return VP8_STATUS_OK;
  return dec->incremental_
             ? VP8_STATUS_SUSPENDED  // Init is ok, but there's not enough data
             : VP8_STATUS_NOT_ENOUGH_DATA;
}